

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioport.c
# Opt level: O0

void cpu_outw_x86_64(uc_struct_conflict *uc,uint32_t addr,uint16_t val)

{
  bool bVar1;
  list_item *local_28;
  list_item *cur;
  hook *hook;
  uint16_t val_local;
  uint32_t addr_local;
  uc_struct_conflict *uc_local;
  
  local_28 = uc->hook[1].head;
  while( true ) {
    bVar1 = false;
    if (local_28 != (list_item *)0x0) {
      cur = (list_item *)local_28->data;
      bVar1 = cur != (list_item *)0x0;
    }
    if (!bVar1) break;
    if ((((ulong)cur[1].next & 0x100000000) == 0) && (*(int *)((long)&cur->next + 4) == 500)) {
      (*(code *)cur[2].data)(uc,addr,2,val,cur[3].next);
    }
    local_28 = local_28->next;
  }
  return;
}

Assistant:

void cpu_outw(struct uc_struct *uc, uint32_t addr, uint16_t val)
{
    // uint8_t buf[2];

    // stw_p(buf, val);
    // address_space_write(&uc->address_space_io, addr, MEMTXATTRS_UNSPECIFIED,
    //                     buf, 2);

    //LOG_IOPORT("outw: %04"FMT_pioaddr" %04"PRIx16"\n", addr, val);
    // Unicorn: call registered OUT callbacks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (hook->insn == UC_X86_INS_OUT)
            ((uc_cb_insn_out_t)hook->callback)(uc, addr, 2, val, hook->user_data);
    }
}